

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_bench.cc
# Opt level: O3

void __thiscall leveldb::Benchmark::HeapProfile(Benchmark *this)

{
  char *pcVar1;
  long *plVar2;
  size_t sVar3;
  Status s;
  WritableFile *file;
  char fname [100];
  undefined1 local_c0 [24];
  undefined1 *local_a8;
  undefined1 local_98 [16];
  char local_88 [104];
  
  pcVar1 = FLAGS_db;
  this->heap_counter_ = this->heap_counter_ + 1;
  snprintf(local_88,100,"%s/heap-%04d",pcVar1);
  plVar2 = (anonymous_namespace)::g_env;
  local_a8 = local_98;
  sVar3 = strlen(local_88);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,local_88,local_88 + sVar3);
  (**(code **)(*plVar2 + 0x20))(local_c0,plVar2,(string *)&local_a8,local_c0 + 8);
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  if ((Cache *)local_c0._0_8_ == (Cache *)0x0) {
    HeapProfile();
  }
  else {
    HeapProfile((Benchmark *)local_c0);
  }
  if ((Cache *)local_c0._0_8_ != (Cache *)0x0) {
    operator_delete__((void *)local_c0._0_8_);
  }
  return;
}

Assistant:

void HeapProfile() {
    char fname[100];
    std::snprintf(fname, sizeof(fname), "%s/heap-%04d", FLAGS_db,
                  ++heap_counter_);
    WritableFile* file;
    Status s = g_env->NewWritableFile(fname, &file);
    if (!s.ok()) {
      std::fprintf(stderr, "%s\n", s.ToString().c_str());
      return;
    }
    bool ok = port::GetHeapProfile(WriteToFile, file);
    delete file;
    if (!ok) {
      std::fprintf(stderr, "heap profiling not supported\n");
      g_env->RemoveFile(fname);
    }
  }